

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,ElseStatement *statement)

{
  CompoundStatement *pCVar1;
  
  std::operator<<((ostream *)&this->field_0x20,"\n");
  print_indentation(this);
  std::operator<<((ostream *)&this->field_0x20,"else:\n");
  this->n_spaces = this->n_spaces + 1;
  pCVar1 = ElseStatement::getStatements(statement);
  (**(pCVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pCVar1,this);
  this->n_spaces = this->n_spaces + -1;
  return;
}

Assistant:

void PrettyPrinter::visit(ElseStatement* statement) {
    output << "\n";
    print_indentation();
    output << "else:\n";
    indent();
    statement->getStatements()->accept(this);
    dedent();
}